

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O3

void __thiscall QLineEdit::setPlaceholderText(QLineEdit *this,QString *placeholderText)

{
  long lVar1;
  long lVar2;
  char cVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QStringView QVar5;
  QStringView QVar6;
  QArrayData *local_58;
  long local_48;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  lVar2 = *(long *)(lVar1 + 0x2b8);
  if (lVar2 == (placeholderText->d).size) {
    QVar5.m_data = (placeholderText->d).ptr;
    QVar5.m_size = lVar2;
    QVar6.m_data = *(storage_type_conflict **)(lVar1 + 0x2b0);
    QVar6.m_size = lVar2;
    cVar3 = QtPrivate::equalStrings(QVar6,QVar5);
    if (cVar3 != '\0') goto LAB_00417fa6;
  }
  QString::operator=((QString *)(lVar1 + 0x2a8),(QString *)placeholderText);
  QWidgetLineControl::text(&local_40,*(QWidgetLineControl **)(lVar1 + 600));
  if (local_40.d.size == 0) {
    QTextLayout::preeditAreaText();
    if (local_48 == 0) {
      bVar4 = true;
      if ((*(byte *)(lVar1 + 0x288) & 4) != 0) {
        bVar4 = QWidget::hasFocus(*(QWidget **)(lVar1 + 8));
        bVar4 = !bVar4;
      }
    }
    else {
      bVar4 = false;
    }
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,0x10);
      }
    }
  }
  else {
    bVar4 = false;
  }
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar4) {
    QWidget::update(&this->super_QWidget);
  }
LAB_00417fa6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEdit::setPlaceholderText(const QString& placeholderText)
{
    Q_D(QLineEdit);
    if (d->placeholderText != placeholderText) {
        d->placeholderText = placeholderText;
        if (d->shouldShowPlaceholderText())
            update();
    }
}